

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O1

XrResult ApiLayerManifestFile::FindManifestFiles
                   (string *openxr_command,ManifestFileType type,
                   vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   *manifest_files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __uid_t _Var3;
  __uid_t _Var4;
  __gid_t _Var5;
  __gid_t _Var6;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  string *psVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  XrResult XVar12;
  string *cur_file;
  string *filename;
  ulong uVar13;
  string __str;
  string relative_path;
  string search_path;
  string xdg_data_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string override_env_var;
  string override_path;
  char home_additional [14];
  size_type __dnew;
  string registry_location;
  string home;
  string xdg_data_home;
  string local_1b8;
  string local_198;
  string local_178;
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  ManifestFileType local_10c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  char *local_f0;
  char *local_e8;
  char local_e0;
  undefined7 uStack_df;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  char local_b0 [16];
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  *local_a0;
  string *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_f0 = &local_e0;
  local_e8 = (char *)0x0;
  local_e0 = '\0';
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_a0 = manifest_files;
  std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)0x0,0x13c69b);
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\x01');
  *local_1b8._M_dataplus._M_p = '1';
  std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  if (type == MANIFEST_TYPE_IMPLICIT_API_LAYER) {
    std::__cxx11::string::append((char *)&local_178);
    pcVar9 = "";
  }
  else {
    if (type != MANIFEST_TYPE_EXPLICIT_API_LAYER) {
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,
                 "ApiLayerManifestFile::FindManifestFiles - unknown manifest file requested","");
      local_138._M_allocated_capacity = 0;
      local_138._8_8_ = 0;
      local_128._M_allocated_capacity = 0;
      LoaderLogger::LogErrorMessage
                (openxr_command,&local_1b8,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_138);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,
                        CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                 local_1b8.field_2._M_local_buf[0]) + 1);
      }
      XVar12 = XR_ERROR_FILE_ACCESS_ERROR;
      goto LAB_00118d80;
    }
    std::__cxx11::string::append((char *)&local_178);
    pcVar9 = "XR_API_LAYER_PATH";
  }
  std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,(ulong)pcVar9);
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  psVar10 = (string *)(local_158 + 0x10);
  local_158._8_8_ = 0;
  local_158[0x10] = '\0';
  local_158._0_8_ = psVar10;
  local_10c = type;
  if (local_e8 != (char *)0x0) {
    _Var3 = geteuid();
    _Var4 = getuid();
    if (_Var3 == _Var4) {
      _Var5 = getegid();
      _Var6 = getgid();
      if (_Var5 == _Var6) {
        PlatformUtilsGetSecureEnv_abi_cxx11_(&local_1b8,local_f0);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p,
                          CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                   local_1b8.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  if (local_c8 == 0) {
    builtin_strncpy(local_b0 + 8,"hare/",6);
    builtin_strncpy(local_b0,".local/s",8);
    PlatformUtilsGetSecureEnv_abi_cxx11_(&local_1b8,"XDG_CONFIG_DIRS");
    PlatformUtilsGetSecureEnv_abi_cxx11_((string *)&local_138,"XDG_DATA_DIRS");
    PlatformUtilsGetSecureEnv_abi_cxx11_(&local_50,"XDG_DATA_HOME");
    PlatformUtilsGetSecureEnv_abi_cxx11_(&local_70,"HOME");
    paVar2 = &local_198.field_2;
    if (local_1b8._M_string_length == 0) {
      local_198.field_2._M_allocated_capacity._0_4_ = 0x6374652f;
      local_198.field_2._M_local_buf[4] = '/';
      local_198.field_2._M_local_buf[5] = 'x';
      local_198.field_2._M_allocated_capacity._6_2_ = 0x6764;
      local_198._M_string_length = 8;
      local_198.field_2._M_local_buf[8] = '\0';
      local_198._M_dataplus._M_p = (pointer)paVar2;
      CopyIncludedPaths(SUB81(&local_198,0),&local_178,(string *)local_158,psVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT26(local_198.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_198.field_2._M_local_buf[5],
                                          CONCAT14(local_198.field_2._M_local_buf[4],
                                                   local_198.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    else {
      CopyIncludedPaths(SUB81(&local_1b8,0),&local_178,(string *)local_158,psVar10);
    }
    local_198.field_2._M_allocated_capacity._0_4_ = 0x7273752f;
    local_198.field_2._M_local_buf[4] = '/';
    local_198.field_2._M_local_buf[5] = 'l';
    local_198.field_2._M_allocated_capacity._6_2_ = 0x636f;
    local_198.field_2._M_local_buf[8] = 'a';
    local_198.field_2._9_5_ = 0x6374652f6c;
    local_198._M_string_length = 0xe;
    local_198.field_2._M_local_buf[0xe] = '\0';
    local_198._M_dataplus._M_p = (pointer)paVar2;
    CopyIncludedPaths(SUB81(&local_198,0),&local_178,(string *)local_158,psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT26(local_198.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_198.field_2._M_local_buf[5],
                                        CONCAT14(local_198.field_2._M_local_buf[4],
                                                 local_198.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_198.field_2._M_allocated_capacity._0_4_ = 0x6374652f;
    local_198._M_string_length = 4;
    local_198.field_2._M_local_buf[4] = '\0';
    local_198._M_dataplus._M_p = (pointer)paVar2;
    CopyIncludedPaths(SUB81(&local_198,0),&local_178,(string *)local_158,psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT26(local_198.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_198.field_2._M_local_buf[5],
                                        CONCAT14(local_198.field_2._M_local_buf[4],
                                                 local_198.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (local_138._8_8_ == 0) {
      local_98 = (string *)0x1b;
      local_198._M_dataplus._M_p = (pointer)paVar2;
      local_198._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_198,(ulong)&local_98);
      local_198.field_2._M_allocated_capacity._0_4_ = SUB84(local_98,0);
      local_198.field_2._M_local_buf[4] = (char)((ulong)local_98 >> 0x20);
      local_198.field_2._M_local_buf[5] = (char)((ulong)local_98 >> 0x28);
      local_198.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)local_98 >> 0x30);
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xb) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xc) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xd) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xf) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x10) = ':';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x11) = '/';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x12) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x13) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x14) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x15) = '/';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x16) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x17) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x18) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x19) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0x1a) = 'e';
      *(undefined8 *)local_198._M_dataplus._M_p = 0x636f6c2f7273752f;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 8) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 9) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 10) = '/';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xb) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xc) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xd) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p + 0xf) = 'e';
      local_198._M_string_length = (size_type)local_98;
      local_198._M_dataplus._M_p[(long)local_98] = '\0';
      psVar10 = local_98;
      CopyIncludedPaths(SUB81(&local_198,0),&local_178,(string *)local_158,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT26(local_198.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_198.field_2._M_local_buf[5],
                                          CONCAT14(local_198.field_2._M_local_buf[4],
                                                   local_198.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    else {
      CopyIncludedPaths(SUB81(&local_138,0),&local_178,(string *)local_158,psVar10);
    }
    if (local_50._M_string_length == 0) {
      if (local_70._M_string_length != 0) {
        local_198._M_dataplus._M_p = (pointer)paVar2;
        sVar8 = strlen(local_b0);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,local_b0,local_b0 + sVar8);
        std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_178._M_dataplus._M_p);
        CopyIncludedPaths(SUB81(&local_70,0),&local_198,(string *)local_158,psVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar2) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT26(local_198.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_198.field_2._M_local_buf[5],
                                            CONCAT14(local_198.field_2._M_local_buf[4],
                                                     local_198.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
      }
    }
    else {
      CopyIncludedPaths(SUB81(&local_50,0),&local_178,(string *)local_158,psVar10);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
    }
  }
  else {
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    CopyIncludedPaths(SUB81(&local_d0,0),&local_1b8,(string *)local_158,psVar10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  uVar13 = 0;
  uVar7 = std::__cxx11::string::find((char)local_158,0x3a);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  if (uVar7 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::substr((ulong)&local_138,(ulong)local_158);
      std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_138._M_local_buf);
      pvVar11 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_allocated_capacity != &local_128) {
        operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1)
        ;
        pvVar11 = extraout_RDX_00;
      }
      CheckAllFilesInThePath(&local_1b8,SUB81(&local_108,0),pvVar11);
      do {
        uVar13 = uVar7 + 1;
        uVar7 = std::__cxx11::string::find((char)local_158,0x3a);
      } while (uVar7 == uVar13);
    } while (uVar7 != 0xffffffffffffffff);
  }
  if (uVar13 < (ulong)local_158._8_8_) {
    std::__cxx11::string::substr((ulong)&local_138,(ulong)local_158);
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_138._M_local_buf);
    pvVar11 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
      pvVar11 = extraout_RDX_02;
    }
    CheckAllFilesInThePath(&local_1b8,SUB81(&local_108,0),pvVar11);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  if ((string *)local_158._0_8_ != (string *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
  }
  filename = local_108.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  psVar10 = local_108.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    filename = local_108.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    psVar10 = local_108.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; filename != psVar10; filename = filename + 1) {
    CreateIfValid(local_10c,filename,local_a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  XVar12 = XR_SUCCESS;
LAB_00118d80:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  return XVar12;
}

Assistant:

XrResult ApiLayerManifestFile::FindManifestFiles(const std::string &openxr_command, ManifestFileType type,
                                                 std::vector<std::unique_ptr<ApiLayerManifestFile>> &manifest_files) {
    std::string relative_path;
    std::string override_env_var;
    std::string registry_location;

    // Add the appropriate top-level folders for the relative path.  These should be
    // the string "openxr/" followed by the API major version as a string.
    relative_path = OPENXR_RELATIVE_PATH;
    relative_path += std::to_string(XR_VERSION_MAJOR(XR_CURRENT_API_VERSION));

    switch (type) {
        case MANIFEST_TYPE_IMPLICIT_API_LAYER:
            relative_path += OPENXR_IMPLICIT_API_LAYER_RELATIVE_PATH;
            override_env_var = "";
#ifdef XR_OS_WINDOWS
            registry_location = OPENXR_IMPLICIT_API_LAYER_REGISTRY_LOCATION;
#endif
            break;
        case MANIFEST_TYPE_EXPLICIT_API_LAYER:
            relative_path += OPENXR_EXPLICIT_API_LAYER_RELATIVE_PATH;
            override_env_var = OPENXR_API_LAYER_PATH_ENV_VAR;
#ifdef XR_OS_WINDOWS
            registry_location = OPENXR_EXPLICIT_API_LAYER_REGISTRY_LOCATION;
#endif
            break;
        default:
            LoaderLogger::LogErrorMessage(openxr_command,
                                          "ApiLayerManifestFile::FindManifestFiles - unknown manifest file requested");
            return XR_ERROR_FILE_ACCESS_ERROR;
    }

    bool override_active = false;
    std::vector<std::string> filenames;
    ReadDataFilesInSearchPaths(override_env_var, relative_path, override_active, filenames);

#ifdef XR_OS_WINDOWS
    // Read the registry if the override wasn't active.
    if (!override_active) {
        ReadLayerDataFilesInRegistry(registry_location, filenames);
    }
#endif

    for (std::string &cur_file : filenames) {
        ApiLayerManifestFile::CreateIfValid(type, cur_file, manifest_files);
    }

#if defined(XR_KHR_LOADER_INIT_SUPPORT) && defined(XR_USE_PLATFORM_ANDROID)
    ApiLayerManifestFile::AddManifestFilesAndroid(openxr_command, type, manifest_files);
#endif  // defined(XR_USE_PLATFORM_ANDROID) && defined(XR_KHR_LOADER_INIT_SUPPORT)

    return XR_SUCCESS;
}